

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O1

int get_curr_stat(CHAR_DATA *ch,int stat)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  CClass *pCVar4;
  int iVar5;
  AFFECT_DATA *paf_find;
  AFFECT_DATA *pAVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  bVar2 = is_npc(ch);
  lVar8 = (long)stat;
  iVar3 = 0x19;
  if ((bVar2) || (0x34 < ch->level)) goto LAB_002a35b5;
  iVar9 = (int)*(short *)((long)ch->race * 0x88 + 0x49ff90 + lVar8 * 2);
  bVar2 = str_cmp(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                  super__Vector_impl_data._M_start[ch->race].name,"human");
  if (!bVar2) {
    pCVar4 = ch->my_class;
    if ((pCVar4 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar4 = ch->pIndexData->my_class, pCVar4 == (CClass *)0x0)))) {
      pCVar4 = CClass::GetClass(0);
    }
    CClass::GetIndex(pCVar4);
    pCVar4 = ch->my_class;
    if ((pCVar4 == (CClass *)0x0) &&
       ((ch->pIndexData == (MOB_INDEX_DATA *)0x0 ||
        (pCVar4 = ch->pIndexData->my_class, pCVar4 == (CClass *)0x0)))) {
      pCVar4 = CClass::GetClass(0);
    }
    switch(pCVar4->attr_prime) {
    case 0:
      if (stat == 0) {
        pCVar4 = char_data::Class(ch);
        iVar3 = CClass::GetIndex(pCVar4);
        iVar9 = 0x17;
        if (iVar3 != 1) {
          pCVar4 = char_data::Class(ch);
          iVar3 = CClass::GetIndex(pCVar4);
          if (iVar3 != 5) {
            pCVar4 = char_data::Class(ch);
            iVar3 = CClass::GetIndex(pCVar4);
            if (iVar3 != 6) {
              pCVar4 = char_data::Class(ch);
              iVar3 = CClass::GetIndex(pCVar4);
              if (iVar3 != 4) goto LAB_002a35a2;
            }
          }
        }
      }
      else {
LAB_002a35a2:
        iVar9 = 0x14;
      }
      break;
    case 1:
      if (stat != 1) goto LAB_002a35a2;
      pCVar4 = char_data::Class(ch);
      iVar3 = CClass::GetIndex(pCVar4);
      iVar9 = 0x17;
      if (iVar3 != 0xb) {
        pCVar4 = char_data::Class(ch);
        iVar3 = CClass::GetIndex(pCVar4);
        if (iVar3 != 10) {
          pCVar4 = char_data::Class(ch);
          iVar3 = CClass::GetIndex(pCVar4);
          if (iVar3 != 8) goto LAB_002a35a2;
        }
      }
      break;
    case 2:
      if (stat != 2) goto LAB_002a35a2;
      pCVar4 = char_data::Class(ch);
      iVar3 = CClass::GetIndex(pCVar4);
      iVar9 = 0x17;
      if (iVar3 != 9) {
        pCVar4 = char_data::Class(ch);
        iVar3 = CClass::GetIndex(pCVar4);
        if (iVar3 != 3) goto LAB_002a35a2;
      }
      break;
    case 3:
      if (stat != 3) goto LAB_002a35a2;
      pCVar4 = char_data::Class(ch);
      iVar3 = CClass::GetIndex(pCVar4);
      iVar9 = 0x17;
      if (iVar3 != 7) {
        pCVar4 = char_data::Class(ch);
        iVar3 = CClass::GetIndex(pCVar4);
        if (iVar3 != 2) goto LAB_002a35a2;
      }
    }
  }
  iVar3 = 0x19;
  if (iVar9 < 0x19) {
    iVar3 = iVar9;
  }
LAB_002a35b5:
  pCVar1 = ch->fighting;
  iVar9 = 0;
  if (pCVar1 != (CHAR_DATA *)0x0) {
    pAVar6 = (AFFECT_DATA *)&pCVar1->affected;
    do {
      pAVar6 = pAVar6->next;
      iVar9 = 0;
      if (pAVar6 == (AFFECT_DATA *)0x0) goto LAB_002a35fa;
    } while (pAVar6->type != gsn_traitors_luck);
    pAVar6 = (AFFECT_DATA *)&pCVar1->affected;
    do {
      pAVar6 = pAVar6->next;
    } while (pAVar6->type != gsn_traitors_luck);
    iVar9 = (uint)(pAVar6->owner == ch) * 2;
  }
LAB_002a35fa:
  iVar7 = (int)ch->mod_stat[lVar8] + (int)ch->perm_stat[lVar8];
  if (iVar7 < iVar3) {
    iVar3 = iVar7;
  }
  iVar5 = 3;
  if (2 < iVar7) {
    iVar5 = iVar3;
  }
  iVar3 = 0x19;
  if (iVar5 + iVar9 < 0x19) {
    iVar3 = iVar5 + iVar9;
  }
  return iVar3;
}

Assistant:

int get_curr_stat(CHAR_DATA *ch, int stat)
{
	AFFECT_DATA *af;
	int max;
	int mod = 0;

	if (is_npc(ch) || ch->level > LEVEL_IMMORTAL)
		max = 25;

	else
	{
		max = pc_race_table[ch->race].max_stats[stat];

		if (!str_cmp(race_table[ch->race].name, "human"))
		{
			int iClass;
			iClass = ch->Class()->GetIndex();
			switch (ch->Class()->attr_prime)
			{
				case STAT_STR:
					if (stat == STAT_STR &&
						(ch->Class()->GetIndex() == CLASS_WARRIOR || ch->Class()->GetIndex() == CLASS_ANTI_PALADIN ||
						ch->Class()->GetIndex() == CLASS_RANGER || ch->Class()->GetIndex() == CLASS_PALADIN))
						max = 23;
					else
						max = 20;
					break;
				case STAT_INT:
					if (stat == STAT_INT &&
						(ch->Class()->GetIndex() == CLASS_SORCERER || ch->Class()->GetIndex() == CLASS_NECROMANCER ||
						ch->Class()->GetIndex() == CLASS_SHAPESHIFTER))
						max = 23;
					else
						max = 20;
					break;
				case STAT_WIS:
					if (stat == STAT_WIS &&
						(ch->Class()->GetIndex() == CLASS_HEALER || ch->Class()->GetIndex() == CLASS_ZEALOT))
						max = 23;
					else
						max = 20;
					break;
				case STAT_DEX:
					if (stat == STAT_DEX &&
						(ch->Class()->GetIndex() == CLASS_ASSASSIN || ch->Class()->GetIndex() == CLASS_THIEF))
						max = 23;
					else
						max = 20;
					break;
			}
		}

		max = std::min(max, 25);
	}

	if (ch->fighting && is_affected(ch->fighting, gsn_traitors_luck))
	{
		af = affect_find(ch->fighting->affected, gsn_traitors_luck);

		if (ch == af->owner)
			mod = 2;
	}

	return std::min(URANGE(3, ch->perm_stat[stat] + ch->mod_stat[stat], max) + mod, 25);
}